

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fInteger64StateQueryTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Functional::Integer64StateQueryTests::init
          (Integer64StateQueryTests *this,EVP_PKEY_CTX *ctx)

{
  undefined4 uVar1;
  Context *pCVar2;
  TestContext *pTVar3;
  int iVar4;
  GetBooleanVerifier *pGVar5;
  undefined4 extraout_var;
  GetIntegerVerifier *pGVar6;
  undefined4 extraout_var_00;
  GetFloatVerifier *pGVar7;
  undefined4 extraout_var_01;
  ApiCase *pAVar8;
  long *plVar9;
  long lVar10;
  long *extraout_RAX;
  long *plVar11;
  int _verifierNdx;
  long lVar12;
  long *local_b0 [2];
  long local_a0 [2];
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  allocator<char> local_69;
  Integer64StateQueryTests *local_68;
  long local_60;
  long local_58;
  GetBooleanVerifier *local_50;
  GetBooleanVerifier *local_48;
  GetIntegerVerifier *pGStack_40;
  GetFloatVerifier *local_38;
  
  pGVar5 = (GetBooleanVerifier *)operator_new(0x28);
  iVar4 = (*((this->super_TestCaseGroup).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&(pGVar5->super_StateVerifier).super_CallLogWrapper,
             (Functions *)CONCAT44(extraout_var,iVar4),
             ((this->super_TestCaseGroup).m_context)->m_testCtx->m_log);
  (pGVar5->super_StateVerifier).m_testNamePostfix = "_getboolean";
  (pGVar5->super_StateVerifier).super_CallLogWrapper.m_enableLog = true;
  (pGVar5->super_StateVerifier)._vptr_StateVerifier = (_func_int **)&PTR__StateVerifier_0214d378;
  this->m_verifierBoolean = pGVar5;
  pGVar6 = (GetIntegerVerifier *)operator_new(0x28);
  iVar4 = (*((this->super_TestCaseGroup).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&(pGVar6->super_StateVerifier).super_CallLogWrapper,
             (Functions *)CONCAT44(extraout_var_00,iVar4),
             ((this->super_TestCaseGroup).m_context)->m_testCtx->m_log);
  (pGVar6->super_StateVerifier).m_testNamePostfix = "_getinteger";
  (pGVar6->super_StateVerifier).super_CallLogWrapper.m_enableLog = true;
  (pGVar6->super_StateVerifier)._vptr_StateVerifier = (_func_int **)&PTR__StateVerifier_0214d3a0;
  this->m_verifierInteger = pGVar6;
  pGVar7 = (GetFloatVerifier *)operator_new(0x28);
  iVar4 = (*((this->super_TestCaseGroup).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&(pGVar7->super_StateVerifier).super_CallLogWrapper,
             (Functions *)CONCAT44(extraout_var_01,iVar4),
             ((this->super_TestCaseGroup).m_context)->m_testCtx->m_log);
  (pGVar7->super_StateVerifier).m_testNamePostfix = "_getfloat";
  (pGVar7->super_StateVerifier).super_CallLogWrapper.m_enableLog = true;
  (pGVar7->super_StateVerifier)._vptr_StateVerifier = (_func_int **)&PTR__StateVerifier_0214d3c8;
  this->m_verifierFloat = pGVar7;
  local_48 = this->m_verifierBoolean;
  pGStack_40 = this->m_verifierInteger;
  local_38 = pGVar7;
  lVar10 = 0;
  local_68 = this;
  do {
    lVar12 = 0;
    local_60 = lVar10;
    do {
      pGVar5 = (&local_48)[lVar12];
      pAVar8 = (ApiCase *)operator_new(0xb0);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_b0,(&PTR_anon_var_dwarf_2a9845c_0214d420)[lVar10 * 4],&local_69);
      plVar9 = (long *)std::__cxx11::string::append((char *)local_b0);
      plVar11 = plVar9 + 2;
      if ((long *)*plVar9 == plVar11) {
        local_80 = *plVar11;
        lStack_78 = plVar9[3];
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar11;
        local_90 = (long *)*plVar9;
      }
      local_88 = plVar9[1];
      *plVar9 = (long)plVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      uVar1 = (&DAT_0214d430)[lVar10 * 8];
      pTVar3 = (TestContext *)(&DAT_0214d438)[lVar10 * 4];
      local_58 = lVar12;
      local_50 = pGVar5;
      ApiCase::ApiCase(pAVar8,pCVar2,(char *)local_90,(char *)(&DAT_0214d428)[lVar10 * 4]);
      this = local_68;
      (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ApiCase_0214d518;
      *(undefined4 *)&pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = uVar1;
      pAVar8[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = pTVar3;
      pAVar8[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
           (pointer)local_50;
      tcu::TestNode::addChild((TestNode *)local_68,(TestNode *)pAVar8);
      if (local_90 != &local_80) {
        operator_delete(local_90,local_80 + 1);
      }
      lVar12 = local_58;
      if (local_b0[0] != local_a0) {
        operator_delete(local_b0[0],local_a0[0] + 1);
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != 3);
    lVar10 = local_60 + 1;
  } while (lVar10 != 3);
  lVar10 = 0;
  do {
    pGVar5 = (&local_48)[lVar10];
    pAVar8 = (ApiCase *)operator_new(0xb0);
    pCVar2 = (local_68->super_TestCaseGroup).m_context;
    local_b0[0] = local_a0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_b0,"max_combined_vertex_uniform_components","");
    plVar9 = (long *)std::__cxx11::string::append((char *)local_b0);
    plVar11 = plVar9 + 2;
    if ((long *)*plVar9 == plVar11) {
      local_80 = *plVar11;
      lStack_78 = plVar9[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar11;
      local_90 = (long *)*plVar9;
    }
    local_88 = plVar9[1];
    *plVar9 = (long)plVar11;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    ApiCase::ApiCase(pAVar8,pCVar2,(char *)local_90,"MAX_COMBINED_VERTEX_UNIFORM_COMPONENTS");
    (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0214d570;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)0x8a2b00008a31;
    *(undefined4 *)&pAVar8[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 0x8b4a;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p = (pointer)pGVar5
    ;
    tcu::TestNode::addChild((TestNode *)local_68,(TestNode *)pAVar8);
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_b0[0] != local_a0) {
      operator_delete(local_b0[0],local_a0[0] + 1);
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  lVar10 = 0;
  do {
    pGVar5 = (&local_48)[lVar10];
    pAVar8 = (ApiCase *)operator_new(0xb0);
    pCVar2 = (local_68->super_TestCaseGroup).m_context;
    local_b0[0] = local_a0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_b0,"max_combined_fragment_uniform_components","");
    plVar9 = (long *)std::__cxx11::string::append((char *)local_b0);
    plVar11 = plVar9 + 2;
    if ((long *)*plVar9 == plVar11) {
      local_80 = *plVar11;
      lStack_78 = plVar9[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar11;
      local_90 = (long *)*plVar9;
    }
    local_88 = plVar9[1];
    *plVar9 = (long)plVar11;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    ApiCase::ApiCase(pAVar8,pCVar2,(char *)local_90,"MAX_COMBINED_FRAGMENT_UNIFORM_COMPONENTS");
    (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0214d570;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)0x8a2d00008a33;
    *(undefined4 *)&pAVar8[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 0x8b49;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p = (pointer)pGVar5
    ;
    tcu::TestNode::addChild((TestNode *)local_68,(TestNode *)pAVar8);
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    plVar9 = local_a0;
    if (local_b0[0] != plVar9) {
      operator_delete(local_b0[0],local_a0[0] + 1);
      plVar9 = extraout_RAX;
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  return (int)plVar9;
}

Assistant:

void Integer64StateQueryTests::init (void)
{
	DE_ASSERT(m_verifierBoolean == DE_NULL);
	DE_ASSERT(m_verifierInteger == DE_NULL);
	DE_ASSERT(m_verifierFloat == DE_NULL);

	m_verifierBoolean		= new GetBooleanVerifier		(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());
	m_verifierInteger		= new GetIntegerVerifier		(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());
	m_verifierFloat			= new GetFloatVerifier			(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());

	const struct LimitedStateInteger64
	{
		const char*		name;
		const char*		description;
		GLenum			targetName;
		GLuint64		minValue;
	} implementationLimits[] =
	{
		{ "max_element_index",			"MAX_ELEMENT_INDEX",		GL_MAX_ELEMENT_INDEX,			0x00FFFFFF /*2^24-1*/	},
		{ "max_server_wait_timeout",	"MAX_SERVER_WAIT_TIMEOUT",	GL_MAX_SERVER_WAIT_TIMEOUT,		0						},
		{ "max_uniform_block_size",		"MAX_UNIFORM_BLOCK_SIZE",	GL_MAX_UNIFORM_BLOCK_SIZE,		16384					}
	};

	// \note do not check the values with integer64 verifier as that has already been checked in implementation_limits
	StateVerifier* verifiers[] = {m_verifierBoolean, m_verifierInteger, m_verifierFloat};

	for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(implementationLimits); testNdx++)
		FOR_EACH_VERIFIER(verifiers, addChild(new ConstantMinimumValue64TestCase(m_context, verifier, (std::string(implementationLimits[testNdx].name) + verifier->getTestNamePostfix()).c_str(), implementationLimits[testNdx].description, implementationLimits[testNdx].targetName, implementationLimits[testNdx].minValue)));

	FOR_EACH_VERIFIER(verifiers, addChild(new MaxCombinedStageUniformComponentsCase (m_context, verifier,	(std::string("max_combined_vertex_uniform_components")		+ verifier->getTestNamePostfix()).c_str(),	"MAX_COMBINED_VERTEX_UNIFORM_COMPONENTS",	GL_MAX_COMBINED_VERTEX_UNIFORM_COMPONENTS,		GL_MAX_VERTEX_UNIFORM_BLOCKS,		GL_MAX_VERTEX_UNIFORM_COMPONENTS)));
	FOR_EACH_VERIFIER(verifiers, addChild(new MaxCombinedStageUniformComponentsCase (m_context, verifier,	(std::string("max_combined_fragment_uniform_components")	+ verifier->getTestNamePostfix()).c_str(),	"MAX_COMBINED_FRAGMENT_UNIFORM_COMPONENTS",	GL_MAX_COMBINED_FRAGMENT_UNIFORM_COMPONENTS,	GL_MAX_FRAGMENT_UNIFORM_BLOCKS,		GL_MAX_FRAGMENT_UNIFORM_COMPONENTS)));
}